

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O1

void __thiscall nuraft::stat_mgr::reset_all_stats(stat_mgr *this)

{
  _Rb_tree_node_base *p_Var1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->stat_map_lock_;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  for (p_Var1 = (this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    stat_elem::reset(*(stat_elem **)(p_Var1 + 2));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void stat_mgr::reset_all_stats() {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    for (auto& entry: stat_map_) {
        stat_elem* elem = entry.second;
        elem->reset();
    }
}